

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utIOStreamBuffer.cpp
# Opt level: O2

void __thiscall
IOStreamBufferTest_accessCacheSizeTest_Test::TestBody
          (IOStreamBufferTest_accessCacheSizeTest_Test *this)

{
  char *pcVar1;
  AssertHelper local_c8;
  AssertHelper local_c0;
  AssertionResult gtest_ar_1;
  IOStreamBuffer<char> myBuffer2;
  IOStreamBuffer<char> myBuffer1;
  
  Assimp::IOStreamBuffer<char>::IOStreamBuffer(&myBuffer1,0x1000000);
  local_c8.data_ = (AssertHelperData *)((ulong)local_c8.data_._4_4_ << 0x20);
  gtest_ar_1._0_8_ = myBuffer1.m_cacheSize;
  testing::internal::CmpHelperNE<unsigned_int,unsigned_long>
            ((internal *)&myBuffer2,"0U","myBuffer1.cacheSize()",(uint *)&local_c8,
             (unsigned_long *)&gtest_ar_1);
  if ((char)myBuffer2.m_stream == '\0') {
    testing::Message::Message((Message *)&gtest_ar_1);
    if (myBuffer2.m_filesize == 0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)myBuffer2.m_filesize;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utIOStreamBuffer.cpp"
               ,0x43,pcVar1);
    testing::internal::AssertHelper::operator=(&local_c8,(Message *)&gtest_ar_1);
    testing::internal::AssertHelper::~AssertHelper(&local_c8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_1);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&myBuffer2.m_filesize);
  Assimp::IOStreamBuffer<char>::IOStreamBuffer(&myBuffer2,100);
  local_c0.data_._0_4_ = 100;
  local_c8.data_ = (AssertHelperData *)myBuffer2.m_cacheSize;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)&gtest_ar_1,"100U","myBuffer2.cacheSize()",(uint *)&local_c0,
             (unsigned_long *)&local_c8);
  if (gtest_ar_1.success_ == false) {
    testing::Message::Message((Message *)&local_c8);
    if (gtest_ar_1.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utIOStreamBuffer.cpp"
               ,0x46,pcVar1);
    testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_c8);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_c8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_1.message_);
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            (&myBuffer2.m_cache.super__Vector_base<char,_std::allocator<char>_>);
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            (&myBuffer1.m_cache.super__Vector_base<char,_std::allocator<char>_>);
  return;
}

Assistant:

TEST_F( IOStreamBufferTest, accessCacheSizeTest ) {
    IOStreamBuffer<char> myBuffer1;
    EXPECT_NE( 0U, myBuffer1.cacheSize() );

    IOStreamBuffer<char> myBuffer2( 100 );
    EXPECT_EQ( 100U, myBuffer2.cacheSize() );
}